

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int max_00;
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr pxVar3;
  int newSize;
  xmlChar *tmp;
  xmlParserCtxtPtr pxStack_c0;
  int max;
  xmlChar *buffer;
  int maxLength;
  int c;
  int l;
  int len;
  xmlChar *cur;
  xmlChar *ret;
  xmlChar buf [105];
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  _l = *str;
  c = 0;
  max_00 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    max_00 = 10000000;
  }
  iVar1 = xmlStringCurrentChar(ctxt,_l,&maxLength);
  iVar2 = xmlIsNameStartChar(ctxt,iVar1);
  if (iVar2 == 0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    if (iVar1 < 0x80) {
      buf[(long)c + -8] = (xmlChar)iVar1;
      c = c + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte(buf + (long)c + -8,iVar1);
      c = iVar1 + c;
    }
    _l = _l + maxLength;
    buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&maxLength);
    do {
      iVar1 = xmlIsNameChar(ctxt,buffer._4_4_);
      if (iVar1 == 0) {
        if (max_00 < c) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          return (xmlChar *)0x0;
        }
        *str = _l;
        cur = xmlStrndup((xmlChar *)&ret,c);
        if (cur == (xmlChar *)0x0) {
          xmlErrMemory(ctxt);
        }
        return cur;
      }
      if (buffer._4_4_ < 0x80) {
        buf[(long)c + -8] = (xmlChar)buffer._4_4_;
        c = c + 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(buf + (long)c + -8,buffer._4_4_);
        c = iVar1 + c;
      }
      _l = _l + maxLength;
      buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&maxLength);
    } while (c < 100);
    tmp._4_4_ = c << 1;
    pxStack_c0 = (xmlParserCtxtPtr)(*xmlMalloc)((long)tmp._4_4_);
    if (pxStack_c0 == (xmlParserCtxtPtr)0x0) {
      xmlErrMemory(ctxt);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      memcpy(pxStack_c0,&ret,(long)c);
      while (iVar1 = xmlIsNameChar(ctxt,buffer._4_4_), iVar1 != 0) {
        pxVar3 = pxStack_c0;
        if (tmp._4_4_ < c + 10) {
          tmp._4_4_ = xmlGrowCapacity(tmp._4_4_,1,1,max_00);
          if (tmp._4_4_ < 0) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
            (*xmlFree)(pxStack_c0);
            return (xmlChar *)0x0;
          }
          pxVar3 = (xmlParserCtxtPtr)(*xmlRealloc)(pxStack_c0,(long)tmp._4_4_);
          if (pxVar3 == (xmlParserCtxtPtr)0x0) {
            xmlErrMemory(ctxt);
            (*xmlFree)(pxStack_c0);
            return (xmlChar *)0x0;
          }
        }
        pxStack_c0 = pxVar3;
        if (buffer._4_4_ < 0x80) {
          *(char *)((long)&pxStack_c0->sax + (long)c) = (char)buffer._4_4_;
          c = c + 1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&pxStack_c0->sax + (long)c),buffer._4_4_);
          c = iVar1 + c;
        }
        _l = _l + maxLength;
        buffer._4_4_ = xmlStringCurrentChar(ctxt,_l,&maxLength);
      }
      *(undefined1 *)((long)&pxStack_c0->sax + (long)c) = 0;
      *str = _l;
      ctxt_local = pxStack_c0;
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(buf, len, c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}